

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O1

int writesimage(fitsfile *fptr,int *status)

{
  int iVar1;
  ulong firstelem;
  float elapcpu;
  double elapse;
  long naxes [2];
  float local_44;
  double local_40;
  long local_38 [3];
  
  local_38[0] = 3000;
  local_38[1] = 3000;
  iVar1 = ffcrim(fptr,0x10,2,local_38,status);
  if (iVar1 == 0) {
    printf("\nWrite %dx%d I*2 image, %d pixels/loop:   ",3000,3000,20000);
    marktime(status);
    firstelem = 0xffffffffffffb1e1;
    do {
      firstelem = firstelem + 20000;
      ffppri(fptr,0,firstelem,20000,ssarray,status);
    } while (firstelem < 0x890621);
    ffflus(fptr,status);
    gettime(&local_40,&local_44,status);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0,local_40,
           (double)(float)(((double)local_44 / local_40) * 100.0),(double)(float)(18.0 / local_40));
    return *status;
  }
  printerror(*status);
}

Assistant:

int writesimage(fitsfile *fptr, int *status)

    /**************************************************/
    /* write the primary array containing a 2-D image */
    /**************************************************/
{
    long  nremain, ii;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* initialize FITS image parameters */
    int bitpix   =  16;   /* 16-bit  signed integer pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = {XSIZE, YSIZE }; /* image size */

    /* write the required keywords for the primary array image */
    if ( fits_create_img(fptr, bitpix, naxis, naxes, status) )
         printerror( *status );          

    printf("\nWrite %dx%d I*2 image, %d pixels/loop:   ",XSIZE,YSIZE,SHTSIZE);
    marktime(status);

    nremain = XSIZE * YSIZE;
    for (ii = 1; ii <= nremain; ii += SHTSIZE)
    {
      ffppri(fptr, 0, ii, SHTSIZE, ssarray, status);
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = XSIZE * 2. * YSIZE / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}